

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_file.c
# Opt level: O0

_Bool internal_file_read(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value;
  gravity_fiber_t *fiber;
  char *s;
  gravity_value_t gVar1;
  gravity_value_t string;
  char *buffer;
  size_t len;
  char *path;
  undefined8 local_1030;
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if ((nargs == 2) || (args[1].isa == gravity_class_string)) {
    len = (size_t)(args[1].field_1.p)->objclass;
    buffer = (char *)0x0;
    s = file_read((char *)len,(size_t *)&buffer);
    if (s == (char *)0x0) {
      gVar1.field_1.n = 0;
      gVar1.isa = gravity_class_null;
      gravity_vm_setslot(vm,gVar1,_buffer._4088_4_);
      vm_local._7_1_ = true;
    }
    else {
      gVar1 = gravity_string_to_value(vm,s,(uint32_t)buffer);
      gravity_vm_setslot(vm,gVar1,_buffer._4088_4_);
      vm_local._7_1_ = true;
    }
  }
  else {
    snprintf(local_1028,0x1000,"A path parameter of type String is required.");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    path = (char *)gravity_class_null;
    local_1030 = 0;
    value.field_1.n = 0;
    value.isa = gravity_class_null;
    gravity_vm_setslot(vm,value,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool internal_file_read (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    // 1 parameter of type string is required
    if (nargs != 2 && !VALUE_ISA_STRING(args[1])) {
        RETURN_ERROR("A path parameter of type String is required.");
    }
    
    char *path = VALUE_AS_STRING(args[1])->s;
    size_t len = 0;
    char *buffer = file_read((const char *)path, &len);
    if (!buffer) {
        RETURN_VALUE(VALUE_FROM_NULL, rindex);
    }
    
    gravity_value_t string = VALUE_FROM_STRING(vm, buffer, (uint32_t)len);
    RETURN_VALUE(string, rindex);
}